

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2f A,vec2f B,vec2f C,vec2f P)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  size_t i;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  vec3f s [2];
  vec2f P_local;
  vec2f C_local;
  vec2f B_local;
  vec2f A_local;
  
  P_local.y = P.y;
  P_local.x = P.x;
  C_local.y = C.y;
  C_local.x = C.x;
  B_local.y = B.y;
  B_local.x = B.x;
  A_local.y = A.y;
  A_local.x = A.x;
  pdVar4 = &s[1].z;
  s[1].y = 0.0;
  s[1].z = 0.0;
  s[0].z = 0.0;
  s[1].x = 0.0;
  s[0].x = 0.0;
  s[0].y = 0.0;
  for (i = 1; i != 0xffffffffffffffff; i = i - 1) {
    pdVar3 = vec<2UL,_double>::operator[](&C_local,i);
    dVar7 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[](&A_local,i);
    dVar8 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[](&B_local,i);
    dVar1 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[](&A_local,i);
    dVar2 = *pdVar3;
    ((vec3f *)(pdVar4 + -2))->x = dVar7 - dVar8;
    pdVar4[-1] = dVar1 - dVar2;
    pdVar3 = vec<2UL,_double>::operator[](&A_local,i);
    dVar7 = *pdVar3;
    pdVar3 = vec<2UL,_double>::operator[](&P_local,i);
    *pdVar4 = dVar7 - *pdVar3;
    pdVar4 = pdVar4 + -3;
  }
  dVar7 = s[0].x * s[1].y - s[1].x * s[0].y;
  if (ABS(dVar7) <= 0.01) {
    dVar8 = -1.0;
    auVar6 = _DAT_00108070;
  }
  else {
    auVar5._0_8_ = s[1].x * s[0].z - s[1].z * s[0].x;
    auVar5._8_8_ = s[0].y * s[1].z - s[1].y * s[0].z;
    dVar8 = 1.0 - (auVar5._8_8_ + auVar5._0_8_) / dVar7;
    auVar6._8_8_ = dVar7;
    auVar6._0_8_ = dVar7;
    auVar6 = divpd(auVar5,auVar6);
  }
  __return_storage_ptr__->x = dVar8;
  __return_storage_ptr__->y = (double)auVar6._0_8_;
  __return_storage_ptr__->z = (double)auVar6._8_8_;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2f A, vec2f B, vec2f C, vec2f P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = C[i] - A[i];
        s[i][1] = B[i] - A[i];
        s[i][2] = A[i] - P[i];
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is zero then triangle
                                // ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown
                             // away by the rasterizer
}